

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

void quaternion_axis_between_EXP(quaternion *self,quaternion *qT,quaternion *qR)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = (self->field_0).q[0];
  fVar2 = (self->field_0).q[1];
  fVar3 = (qT->field_0).q[2];
  fVar4 = (self->field_0).q[2];
  fVar5 = (qT->field_0).q[0];
  fVar6 = (qT->field_0).q[1];
  (qR->field_0).q[0] = fVar2 * fVar3 - fVar6 * fVar4;
  (qR->field_0).q[1] = fVar4 * fVar5 - fVar3 * fVar1;
  (qR->field_0).q[2] = fVar1 * fVar6 - fVar5 * fVar2;
  (qR->field_0).q[3] = -(fVar4 * fVar3 + fVar1 * fVar5 + fVar2 * fVar6);
  quaternion_normalize(qR);
  return;
}

Assistant:

HYPAPI struct quaternion quaternion_cross_product_EXP(const struct quaternion *self, const struct quaternion *vT)
{
	/*
	 * The code is suspect (missing w element in this whole thing)
	 * It is computing a cross-product on the vector portion and a
	 * negative dot product on the real portion.
	 */
	struct quaternion r;

	r.x = (self->y * vT->z) - (self->z * vT->y);
	r.y = (self->z * vT->x) - (self->x * vT->z);
	r.z = (self->x * vT->y) - (self->y * vT->x);
	r.w = -((self->x * vT->x) + (self->y * vT->y) + (self->z * vT->z));

	return r;
}